

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

void fmt::v10::detail::convert_arg<short,fmt::v10::basic_printf_context<char>,char>
               (basic_format_arg<fmt::v10::basic_printf_context<char>_> *arg,char type)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  unkbyte10 in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef2;
  arg_converter<short,_fmt::v10::basic_printf_context<char>_> local_d0;
  char local_b9;
  basic_format_arg<fmt::v10::basic_printf_context<char>_> *pbStack_b8;
  char type_local;
  basic_format_arg<fmt::v10::basic_printf_context<char>_> *arg_local;
  longlong local_a8;
  size_t local_a0;
  custom_value<fmt::v10::basic_printf_context<char>_> local_98;
  basic_string_view<char> local_88;
  unsigned___int128 *local_78;
  unsigned___int128 *local_68;
  unsigned___int128 *local_58;
  detail *local_50;
  __int128 *local_48;
  __int128 *local_38;
  __int128 *local_28;
  size_t local_20;
  basic_format_arg<fmt::v10::basic_printf_context<char>_> *local_18;
  arg_converter<short,_fmt::v10::basic_printf_context<char>_> *local_10;
  
  local_b9 = type;
  pbStack_b8 = arg;
  arg_converter<short,_fmt::v10::basic_printf_context<char>_>::arg_converter(&local_d0,arg,type);
  local_18 = pbStack_b8;
  local_10 = &local_d0;
  switch(pbStack_b8->type_) {
  case none_type:
  default:
    monostate::monostate((monostate *)((long)&arg_local + 7));
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<fmt::v10::monostate,_0>
              (&local_d0);
    break;
  case int_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<int,_0>
              (&local_d0,(pbStack_b8->value_).field_0.int_value);
    break;
  case uint_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<unsigned_int,_0>
              (&local_d0,(pbStack_b8->value_).field_0.uint_value);
    break;
  case long_long_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<long_long,_0>
              (&local_d0,(pbStack_b8->value_).field_0.long_long_value);
    break;
  case ulong_long_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<unsigned_long_long,_0>
              (&local_d0,(pbStack_b8->value_).field_0.ulong_long_value);
    break;
  case int128_type:
    local_28 = (__int128 *)(pbStack_b8->value_).field_0.string.data;
    local_20 = (pbStack_b8->value_).field_0.string.size;
    value._10_6_ = in_stack_fffffffffffffef2;
    value._0_10_ = in_stack_fffffffffffffee8;
    local_48 = convert_for_visit<__int128>(local_28,(__int128)value);
    value_00._10_6_ = in_stack_fffffffffffffef2;
    value_00._0_10_ = in_stack_fffffffffffffee8;
    local_38 = local_48;
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<__int128,_0>
              (&local_d0,(__int128)value_00);
    break;
  case uint128_type:
    local_58 = (unsigned___int128 *)(pbStack_b8->value_).field_0.string.data;
    local_50 = (detail *)(pbStack_b8->value_).field_0.custom.format;
    value_01._10_6_ = in_stack_fffffffffffffef2;
    value_01._0_10_ = in_stack_fffffffffffffee8;
    local_78 = convert_for_visit<unsigned__int128>(local_58,local_50,(unsigned___int128)value_01);
    value_02._10_6_ = in_stack_fffffffffffffef2;
    value_02._0_10_ = in_stack_fffffffffffffee8;
    local_68 = local_78;
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<unsigned___int128,_0>
              (&local_d0,(unsigned___int128)value_02);
    break;
  case bool_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()
              (&local_d0,(bool)((pbStack_b8->value_).field_0.char_value & 1));
    break;
  case char_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<char,_0>
              (&local_d0,(pbStack_b8->value_).field_0.char_value);
    break;
  case float_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<float,_0>
              (&local_d0,(pbStack_b8->value_).field_0.float_value);
    break;
  case double_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<double,_0>
              (&local_d0,(pbStack_b8->value_).field_0.double_value);
    break;
  case last_numeric_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<long_double,_0>
              (&local_d0,(pbStack_b8->value_).field_0.long_double_value);
    break;
  case cstring_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<const_char_*,_0>
              (&local_d0,(pbStack_b8->value_).field_0.string.data);
    break;
  case string_type:
    basic_string_view<char>::basic_string_view
              (&local_88,(pbStack_b8->value_).field_0.string.data,
               (pbStack_b8->value_).field_0.string.size);
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::
    operator()<fmt::v10::basic_string_view<char>,_0>(&local_d0,local_88);
    break;
  case pointer_type:
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::operator()<const_void_*,_0>
              (&local_d0,(pbStack_b8->value_).field_0.pointer);
    break;
  case custom_type:
    local_a8 = (pbStack_b8->value_).field_0.long_long_value;
    local_a0 = (pbStack_b8->value_).field_0.string.size;
    basic_format_arg<fmt::v10::basic_printf_context<char>_>::handle::handle
              ((handle *)&local_98,(pbStack_b8->value_).field_0.custom);
    arg_converter<short,_fmt::v10::basic_printf_context<char>_>::
    operator()<fmt::v10::basic_format_arg<fmt::v10::basic_printf_context<char>_>::handle,_0>
              (&local_d0,(handle)local_98);
  }
  return;
}

Assistant:

void convert_arg(basic_format_arg<Context>& arg, Char type) {
  visit_format_arg(arg_converter<T, Context>(arg, type), arg);
}